

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O2

h2o_filecache_ref_t * h2o_filecache_open_file(h2o_filecache_t *cache,char *path,int oflag)

{
  h2o_linklist_t *phVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  kh_cstr_t pcVar6;
  khint32_t *pkVar7;
  st_h2o_linklist_t *psVar8;
  st_h2o_linklist_t *psVar9;
  ulong uVar10;
  khint_t kVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  size_t sVar15;
  h2o_filecache_ref_t *ref;
  size_t sVar16;
  int *piVar17;
  sbyte sVar18;
  byte bVar19;
  uint uVar20;
  char *pcVar21;
  kh_opencache_set_t *pkVar22;
  ulong uVar23;
  char *__file;
  char *__assertion;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  
  pkVar22 = cache->hash;
  kVar11 = kh_get_opencache_set(pkVar22,path);
  if (kVar11 == pkVar22->n_buckets) {
    sVar15 = strlen(path);
    ref = (h2o_filecache_ref_t *)h2o_mem_alloc(sVar15 + 0x131);
    ref->_refcnt = 1;
    pcVar21 = ref->_path;
    (ref->_lru).next = (st_h2o_linklist_t *)0x0;
    (ref->_lru).prev = (st_h2o_linklist_t *)0x0;
    strcpy(pcVar21,path);
    if (cache->capacity != 0) {
      pkVar22 = cache->hash;
      if (cache->capacity == (ulong)pkVar22->size) {
        kVar11 = kh_get_opencache_set(pkVar22,(kh_cstr_t)((cache->lru).prev + 0x12));
        if (kVar11 == pkVar22->n_buckets) {
          __assertion = "purge_iter != kh_end(cache->hash)";
          __file = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
          ;
          pcVar21 = 
          "h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *, const char *, int)";
          uVar5 = 0x6c;
          goto LAB_0012a18c;
        }
        release_from_cache(cache,kVar11);
        pkVar22 = cache->hash;
        sVar16 = ref->_refcnt + 1;
      }
      else {
        sVar16 = 2;
      }
      phVar1 = &ref->_lru;
      ref->_refcnt = sVar16;
      if (pkVar22->n_occupied < pkVar22->upper_bound) {
LAB_00129f11:
        uVar5 = pkVar22->n_buckets;
        kVar11 = __ac_X31_hash_string(pcVar21);
        uVar24 = kVar11 & uVar5 - 1;
        uVar23 = (ulong)uVar24;
        pkVar7 = pkVar22->flags;
        if ((pkVar7[uVar24 >> 4] >> ((char)uVar24 * '\x02' & 0x1fU) & 2) == 0) {
          iVar12 = 1;
          uVar23 = (ulong)uVar5;
          uVar26 = uVar24;
          do {
            uVar20 = pkVar7[uVar26 >> 4];
            uVar25 = uVar26 * 2 & 0x1e;
            sVar18 = (sbyte)uVar25;
            uVar13 = uVar20 >> sVar18;
            if (((uVar13 & 2) != 0) ||
               (((uVar13 & 1) == 0 && (iVar14 = strcmp(pkVar22->keys[uVar26],pcVar21), iVar14 == 0))
               )) {
              bVar27 = (uVar20 >> sVar18 & 2) == 0;
              uVar20 = (uint)uVar23;
              goto LAB_0012a033;
            }
            if ((uVar20 >> uVar25 & 1) != 0) {
              uVar23 = (ulong)uVar26;
            }
            uVar26 = uVar26 + iVar12 & uVar5 - 1;
            iVar12 = iVar12 + 1;
          } while (uVar26 != uVar24);
          bVar27 = true;
          uVar20 = uVar5;
          uVar26 = uVar24;
          if ((uint)uVar23 == uVar5) {
LAB_0012a033:
            if (uVar20 == uVar5) {
              uVar20 = uVar26;
            }
            if (bVar27) {
              uVar20 = uVar26;
            }
            uVar23 = (ulong)uVar20;
          }
        }
        uVar10 = uVar23 >> 4;
        bVar19 = (char)uVar23 * '\x02' & 0x1e;
        if ((pkVar7[uVar10] >> bVar19 & 2) == 0) {
          if ((pkVar7[uVar10] >> bVar19 & 1) != 0) {
            pkVar22->keys[uVar23] = pcVar21;
            pkVar22->flags[uVar10] = pkVar22->flags[uVar10] & ~(3 << bVar19);
            pkVar22->size = pkVar22->size + 1;
          }
        }
        else {
          pkVar22->keys[uVar23] = pcVar21;
          pkVar22->flags[uVar10] = pkVar22->flags[uVar10] & ~(3 << bVar19);
          uVar3 = pkVar22->size;
          uVar4 = pkVar22->n_occupied;
          pkVar22->size = uVar3 + 1;
          pkVar22->n_occupied = uVar4 + 1;
        }
      }
      else {
        uVar5 = pkVar22->n_buckets;
        if (pkVar22->size * 2 < uVar5) {
          kVar11 = uVar5 - 1;
        }
        else {
          kVar11 = uVar5 + 1;
        }
        iVar12 = kh_resize_opencache_set(pkVar22,kVar11);
        if (-1 < iVar12) goto LAB_00129f11;
      }
      if (phVar1->next != (st_h2o_linklist_t *)0x0) {
        __assertion = "!h2o_linklist_is_linked(node)";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/linklist.h";
        pcVar21 = "void h2o_linklist_insert(h2o_linklist_t *, h2o_linklist_t *)";
        uVar5 = 0x59;
LAB_0012a18c:
        __assert_fail(__assertion,__file,uVar5,pcVar21);
      }
      psVar8 = (cache->lru).next;
      psVar9 = psVar8->prev;
      (ref->_lru).prev = psVar9;
      (ref->_lru).next = psVar8;
      psVar9->next = phVar1;
      ((ref->_lru).next)->prev = phVar1;
    }
    iVar12 = open(path,oflag);
    ref->fd = iVar12;
    if (iVar12 == -1) {
      iVar12 = -1;
    }
    else {
      iVar12 = fstat(iVar12,(stat *)&(ref->field_3).field_0);
      if (iVar12 == 0) {
        *(undefined1 *)((long)&ref->field_3 + 200) = 0;
        *(undefined8 *)((long)&ref->field_3 + 0x108) = 0;
        goto LAB_0012a12d;
      }
      iVar12 = ref->fd;
    }
    piVar17 = __errno_location();
    (ref->field_3).open_err = *piVar17;
    if (iVar12 != -1) {
      close(iVar12);
      ref->fd = -1;
      goto LAB_0012a13a;
    }
  }
  else {
    pcVar6 = pkVar22->keys[kVar11];
    plVar2 = (long *)(pcVar6 + -0x128);
    *plVar2 = *plVar2 + 1;
    ref = (h2o_filecache_ref_t *)(pcVar6 + -0x130);
  }
LAB_0012a12d:
  if (ref->fd != -1) {
    return ref;
  }
  piVar17 = __errno_location();
LAB_0012a13a:
  *piVar17 = (ref->field_3).open_err;
  h2o_filecache_close_file(ref);
  return (h2o_filecache_ref_t *)0x0;
}

Assistant:

h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *cache, const char *path, int oflag)
{
    khiter_t iter = kh_get(opencache_set, cache->hash, path);
    h2o_filecache_ref_t *ref;
    int dummy;

    /* lookup cache, and return the one if found */
    if (iter != kh_end(cache->hash)) {
        ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _path, kh_key(cache->hash, iter));
        ++ref->_refcnt;
        goto Exit;
    }

    /* create a new cache entry */
    ref = h2o_mem_alloc(offsetof(h2o_filecache_ref_t, _path) + strlen(path) + 1);
    ref->_refcnt = 1;
    ref->_lru = (h2o_linklist_t){NULL};
    strcpy(ref->_path, path);

    /* if cache is used, then... */
    if (cache->capacity != 0) {
        /* purge one entry from LRU if cache is full */
        if (kh_size(cache->hash) == cache->capacity) {
            h2o_filecache_ref_t *purge_ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _lru, cache->lru.prev);
            khiter_t purge_iter = kh_get(opencache_set, cache->hash, purge_ref->_path);
            assert(purge_iter != kh_end(cache->hash));
            release_from_cache(cache, purge_iter);
        }
        /* assign the new entry */
        ++ref->_refcnt;
        kh_put(opencache_set, cache->hash, ref->_path, &dummy);
        h2o_linklist_insert(cache->lru.next, &ref->_lru);
    }

    /* open the file, or memoize the error */
    if ((ref->fd = open(path, oflag)) != -1 && fstat(ref->fd, &ref->st) == 0) {
        ref->_last_modified.str[0] = '\0';
        ref->_etag.len = 0;
    } else {
        ref->open_err = errno;
        if (ref->fd != -1) {
            close(ref->fd);
            ref->fd = -1;
        }
    }

Exit:
    /* if the cache entry retains an error, return it instead of the reference */
    if (ref->fd == -1) {
        errno = ref->open_err;
        h2o_filecache_close_file(ref);
        ref = NULL;
    }
    return ref;
}